

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartitioningAroundMedoids.h
# Opt level: O0

DistanceType __thiscall
CPartitioningAroundMedois<CDissimilarityMatrix<float>_>::FindObjectDistanceToAll
          (CPartitioningAroundMedois<CDissimilarityMatrix<float>_> *this,size_t object)

{
  size_t sVar1;
  DistanceType DVar2;
  ulong local_28;
  size_t anotherObject;
  DistanceType distance;
  size_t object_local;
  CPartitioningAroundMedois<CDissimilarityMatrix<float>_> *this_local;
  
  sVar1 = NumberOfObjects(this);
  if (object < sVar1) {
    anotherObject._4_4_ = 0.0;
    local_28 = 0;
    while( true ) {
      sVar1 = NumberOfObjects(this);
      if (sVar1 <= local_28) break;
      DVar2 = CDissimilarityMatrix<float>::Distance(this->matrix,object,local_28);
      anotherObject._4_4_ = DVar2 + anotherObject._4_4_;
      local_28 = local_28 + 1;
    }
    return anotherObject._4_4_;
  }
  __assert_fail("object < NumberOfObjects()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                ,0x4c,
                "typename CPartitioningAroundMedois<DMT>::DistanceType CPartitioningAroundMedois<CDissimilarityMatrix<float>>::FindObjectDistanceToAll(size_t) const [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
               );
}

Assistant:

typename CPartitioningAroundMedois<DMT>::DistanceType
CPartitioningAroundMedois<DMT>::FindObjectDistanceToAll( size_t object ) const
{
	assert( object < NumberOfObjects() );

	DistanceType distance = 0;
	for( size_t anotherObject = 0; anotherObject < NumberOfObjects(); anotherObject++ ) {
		distance += matrix.Distance( object, anotherObject );
	}

	return distance;
}